

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O2

void amqp_management_destroy(AMQP_MANAGEMENT_HANDLE amqp_management)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (amqp_management != (AMQP_MANAGEMENT_HANDLE)0x0) {
    if (amqp_management->amqp_management_state != AMQP_MANAGEMENT_STATE_IDLE) {
      amqp_management_close(amqp_management);
    }
    messagesender_destroy(amqp_management->message_sender);
    messagereceiver_destroy(amqp_management->message_receiver);
    link_destroy(amqp_management->sender_link);
    link_destroy(amqp_management->receiver_link);
    free(amqp_management->status_code_key_name);
    free(amqp_management->status_description_key_name);
    singlylinkedlist_destroy(amqp_management->pending_operations);
    free(amqp_management);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
               ,"amqp_management_destroy",0x3b9,1,"NULL amqp_management");
    return;
  }
  return;
}

Assistant:

void amqp_management_destroy(AMQP_MANAGEMENT_HANDLE amqp_management)
{
    if (amqp_management == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_025: [ If `amqp_management` is NULL, `amqp_management_destroy` shall do nothing. ]*/
        LogError("NULL amqp_management");
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_024: [ `amqp_management_destroy` shall free all the resources allocated by `amqp_management_create`. ]*/
        if (amqp_management->amqp_management_state != AMQP_MANAGEMENT_STATE_IDLE)
        {
            (void)amqp_management_close(amqp_management);
        }

        /* Codes_SRS_AMQP_MANAGEMENT_01_028: [ `amqp_management_destroy` shall free the message sender by calling `messagesender_destroy`. ]*/
        messagesender_destroy(amqp_management->message_sender);
        /* Codes_SRS_AMQP_MANAGEMENT_01_029: [ `amqp_management_destroy` shall free the message receiver by calling `messagereceiver_destroy`. ]*/
        messagereceiver_destroy(amqp_management->message_receiver);
        /* Codes_SRS_AMQP_MANAGEMENT_01_027: [ `amqp_management_destroy` shall free the sender and receiver links by calling `link_destroy`. ]*/
        link_destroy(amqp_management->sender_link);
        link_destroy(amqp_management->receiver_link);
        free(amqp_management->status_code_key_name);
        free(amqp_management->status_description_key_name);
        /* Codes_SRS_AMQP_MANAGEMENT_01_026: [ `amqp_management_destroy` shall free the singly linked list by calling `singlylinkedlist_destroy`. ]*/
        singlylinkedlist_destroy(amqp_management->pending_operations);
        free(amqp_management);
    }
}